

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool __thiscall
QCss::ValueExtractor::extractBorder
          (ValueExtractor *this,int *borders,QBrush *colors,BorderStyle *styles,QSize *radii)

{
  QBrush *color;
  QPalette *pal;
  int iVar1;
  Declaration *pDVar2;
  DeclarationData *pDVar3;
  bool bVar4;
  BorderStyle BVar5;
  QBrush *pQVar6;
  _Head_base<0UL,_QBrushData_*,_false> _Var7;
  QSize QVar8;
  long lVar9;
  BorderStyle *pBVar10;
  int *width;
  ulong uVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  int dummy;
  _Head_base<0UL,_QBrushData_*,_false> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fontExtracted == 0) {
    local_40._M_head_impl._0_4_ = 0xffffff01;
    extractFont(this,&this->f,(int *)&local_40);
  }
  if ((this->declarations).d.size == 0) {
    bVar4 = false;
  }
  else {
    color = colors + 3;
    uVar11 = 0;
    bVar4 = false;
    do {
      pDVar2 = (this->declarations).d.ptr;
      pDVar3 = pDVar2[uVar11].d.d.ptr;
      if (0x21 < pDVar3->propertyId - Border) goto switchD_005e66db_caseD_1f;
      pal = (QPalette *)(pDVar2 + uVar11);
      switch(pDVar3->propertyId) {
      case Border:
        borderValue(this,(Declaration *)pal,borders + 3,styles + 3,color);
        iVar1 = borders[3];
        borders[2] = iVar1;
        borders[1] = iVar1;
        *borders = iVar1;
        BVar5 = styles[3];
        styles[2] = BVar5;
        styles[1] = BVar5;
        *styles = BVar5;
        pQVar6 = QBrush::operator=(colors + 2,color);
        pQVar6 = QBrush::operator=(colors + 1,pQVar6);
        QBrush::operator=(colors,pQVar6);
        break;
      case BorderLeft:
        pBVar10 = styles + 3;
        width = borders + 3;
        pQVar6 = color;
        goto LAB_005e68a3;
      case BorderRight:
        pBVar10 = styles + 1;
        width = borders + 1;
        pQVar6 = colors + 1;
        goto LAB_005e68a3;
      case BorderTop:
        pBVar10 = styles;
        width = borders;
        pQVar6 = colors;
        goto LAB_005e68a3;
      case BorderBottom:
        pBVar10 = styles + 2;
        width = borders + 2;
        pQVar6 = colors + 2;
LAB_005e68a3:
        borderValue(this,(Declaration *)pal,width,pBVar10,pQVar6);
        break;
      default:
        goto switchD_005e66db_caseD_1f;
      case BorderLeftStyle:
        BVar5 = BorderStyle_None;
        pBVar10 = styles;
        if ((pDVar3->values).d.size == 1) {
          BVar5 = parseStyleValue((pDVar3->values).d.ptr);
        }
        goto LAB_005e6978;
      case BorderRightStyle:
        BVar5 = BorderStyle_None;
        pBVar10 = styles;
        if ((pDVar3->values).d.size == 1) {
          BVar5 = parseStyleValue((pDVar3->values).d.ptr);
        }
        goto LAB_005e69c9;
      case BorderTopStyle:
        BVar5 = BorderStyle_None;
        pBVar10 = styles;
        if ((pDVar3->values).d.size == 1) {
          BVar5 = parseStyleValue((pDVar3->values).d.ptr);
        }
        goto LAB_005e69b8;
      case BorderBottomStyle:
        BVar5 = BorderStyle_None;
        pBVar10 = styles;
        if ((pDVar3->values).d.size == 1) {
          BVar5 = parseStyleValue((pDVar3->values).d.ptr);
        }
        goto LAB_005e69a6;
      case BorderStyles:
        Declaration::styleValues((Declaration *)pal,styles);
        break;
      case BorderLeftColor:
        Declaration::brushValue((Declaration *)&local_40,pal);
        _Var7._M_head_impl =
             colors[3].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
             super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
        colors[3].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = local_40._M_head_impl;
        goto LAB_005e686e;
      case BorderRightColor:
        Declaration::brushValue((Declaration *)&local_40,pal);
        _Var7._M_head_impl =
             colors[1].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
             super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
        colors[1].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = local_40._M_head_impl;
        goto LAB_005e686e;
      case BorderTopColor:
        Declaration::brushValue((Declaration *)&local_40,pal);
        _Var7._M_head_impl =
             (colors->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
             super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
        (colors->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = local_40._M_head_impl;
        goto LAB_005e686e;
      case BorderBottomColor:
        Declaration::brushValue((Declaration *)&local_40,pal);
        _Var7._M_head_impl =
             colors[2].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
             super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
        colors[2].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = local_40._M_head_impl;
LAB_005e686e:
        local_40._M_head_impl = _Var7._M_head_impl;
        QBrush::~QBrush((QBrush *)&local_40);
        break;
      case BorderColor:
        Declaration::brushValues((Declaration *)pal,colors,&this->pal);
        break;
      case BorderLeftWidth:
        BVar5 = lengthValue(this,(Declaration *)pal);
        pBVar10 = (BorderStyle *)borders;
LAB_005e6978:
        pBVar10[3] = BVar5;
        break;
      case BorderRightWidth:
        BVar5 = lengthValue(this,(Declaration *)pal);
        pBVar10 = (BorderStyle *)borders;
LAB_005e69c9:
        pBVar10[1] = BVar5;
        break;
      case BorderTopWidth:
        BVar5 = lengthValue(this,(Declaration *)pal);
        pBVar10 = (BorderStyle *)borders;
LAB_005e69b8:
        *pBVar10 = BVar5;
        break;
      case BorderBottomWidth:
        BVar5 = lengthValue(this,(Declaration *)pal);
        pBVar10 = (BorderStyle *)borders;
LAB_005e69a6:
        pBVar10[2] = BVar5;
        break;
      case BorderWidth:
        lengthValues(this,(Declaration *)pal,borders);
        break;
      case BorderTopLeftRadius:
        QVar8 = sizeValue(this,(Declaration *)pal);
        *radii = QVar8;
        break;
      case BorderTopRightRadius:
        QVar8 = sizeValue(this,(Declaration *)pal);
        radii[1] = QVar8;
        break;
      case BorderBottomLeftRadius:
        QVar8 = sizeValue(this,(Declaration *)pal);
        radii[2] = QVar8;
        break;
      case BorderBottomRightRadius:
        QVar8 = sizeValue(this,(Declaration *)pal);
        radii[3] = QVar8;
        break;
      case BorderRadius:
        QVar8 = sizeValue(this,(Declaration *)pal);
        *radii = QVar8;
        lVar9 = 0;
        do {
          auVar12._8_4_ = (int)lVar9;
          auVar12._0_8_ = lVar9;
          auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar12 = (auVar12 | _DAT_00684840) ^ _DAT_00684850;
          if (auVar12._4_4_ == -0x80000000 && auVar12._0_4_ < -0x7ffffffd) {
            radii[lVar9 + 1] = QVar8;
            radii[lVar9 + 2] = QVar8;
          }
          lVar9 = lVar9 + 2;
        } while (lVar9 != 4);
      }
      bVar4 = true;
switchD_005e66db_caseD_1f:
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(this->declarations).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool ValueExtractor::extractBorder(int *borders, QBrush *colors, BorderStyle *styles,
                                   QSize *radii)
{
    extractFont();
    bool hit = false;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case BorderLeftWidth: borders[LeftEdge] = lengthValue(decl); break;
        case BorderRightWidth: borders[RightEdge] = lengthValue(decl); break;
        case BorderTopWidth: borders[TopEdge] = lengthValue(decl); break;
        case BorderBottomWidth: borders[BottomEdge] = lengthValue(decl); break;
        case BorderWidth: lengthValues(decl, borders); break;

        case BorderLeftColor: colors[LeftEdge] = decl.brushValue(pal); break;
        case BorderRightColor: colors[RightEdge] = decl.brushValue(pal); break;
        case BorderTopColor: colors[TopEdge] = decl.brushValue(pal); break;
        case BorderBottomColor: colors[BottomEdge] = decl.brushValue(pal); break;
        case BorderColor: decl.brushValues(colors, pal); break;

        case BorderTopStyle: styles[TopEdge] = decl.styleValue(); break;
        case BorderBottomStyle: styles[BottomEdge] = decl.styleValue(); break;
        case BorderLeftStyle: styles[LeftEdge] = decl.styleValue(); break;
        case BorderRightStyle: styles[RightEdge] = decl.styleValue(); break;
        case BorderStyles:  decl.styleValues(styles); break;

        case BorderTopLeftRadius: radii[0] = sizeValue(decl); break;
        case BorderTopRightRadius: radii[1] = sizeValue(decl); break;
        case BorderBottomLeftRadius: radii[2] = sizeValue(decl); break;
        case BorderBottomRightRadius: radii[3] = sizeValue(decl); break;
        case BorderRadius: sizeValues(decl, radii); break;

        case BorderLeft:
            borderValue(decl, &borders[LeftEdge], &styles[LeftEdge], &colors[LeftEdge]);
            break;
        case BorderTop:
            borderValue(decl, &borders[TopEdge], &styles[TopEdge], &colors[TopEdge]);
            break;
        case BorderRight:
            borderValue(decl, &borders[RightEdge], &styles[RightEdge], &colors[RightEdge]);
            break;
        case BorderBottom:
            borderValue(decl, &borders[BottomEdge], &styles[BottomEdge], &colors[BottomEdge]);
            break;
        case Border:
            borderValue(decl, &borders[LeftEdge], &styles[LeftEdge], &colors[LeftEdge]);
            borders[TopEdge] = borders[RightEdge] = borders[BottomEdge] = borders[LeftEdge];
            styles[TopEdge] = styles[RightEdge] = styles[BottomEdge] = styles[LeftEdge];
            colors[TopEdge] = colors[RightEdge] = colors[BottomEdge] = colors[LeftEdge];
            break;

        default: continue;
        }
        hit = true;
    }

    return hit;
}